

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshproxy.c
# Opt level: O0

size_t sshproxy_banner(Seat *seat,void *data,size_t len)

{
  InteractionReadySeat iseat;
  SshProxy *sp;
  size_t len_local;
  void *data_local;
  Seat *seat_local;
  
  if (seat[-0x411].vt == (SeatVtable *)0x0) {
    seat_local = (Seat *)0x0;
  }
  else {
    iseat = wrap((Seat *)seat[-0x411].vt);
    seat_local = (Seat *)seat_banner(iseat,data,len);
  }
  return (size_t)seat_local;
}

Assistant:

static size_t sshproxy_banner(Seat *seat, const void *data, size_t len)
{
    SshProxy *sp = container_of(seat, SshProxy, seat);
    if (sp->clientseat) {
        /*
         * If we have access to the outer Seat, pass the SSH login
         * banner on to it.
         */
        return seat_banner(wrap(sp->clientseat), data, len);
    } else {
        return 0;
    }
}